

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O0

void __thiscall
HostVector_copy_constructor_Test::HostVector_copy_constructor_Test
          (HostVector_copy_constructor_Test *this)

{
  HostVector_copy_constructor_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HostVector_copy_constructor_Test_001c0bf0;
  return;
}

Assistant:

TEST(HostVector, copy_constructor) {
    using namespace memory;

    // length constructor
    HostVector<float> v1(100);

    // initialize values as monotone sequence
    for(int i=0; i<v1.size(); ++i)
        v1[i] = float(i);

    // copy constructor
    //HostVector<float> v2;
    //v2 = v1;
    HostVector<float> v2 = v1;

    // ensure that new memory was allocated
    EXPECT_NE(v2.data(), v1.data());

    // check that v3 has values originally copied over from v1
    for(int i=0; i<100; i++)
        EXPECT_EQ(v1[i], v2[i]);
}